

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_metadata_info.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::PragmaMetadataInfoBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  vector<duckdb::Value,_true> *this_00;
  reference pvVar1;
  Catalog *pCVar2;
  pointer pPVar3;
  BinderException *this_01;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::PragmaMetadataFunctionData,_std::default_delete<duckdb::PragmaMetadataFunctionData>_>
  local_78;
  string local_70;
  string db_name;
  
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [9])"block_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"total_blocks");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"free_blocks");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"free_list");
  LogicalType::LogicalType((LogicalType *)&local_70,BIGINT);
  LogicalType::LIST((LogicalType *)&db_name,(LogicalType *)&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (LogicalType *)&db_name);
  LogicalType::~LogicalType((LogicalType *)&db_name);
  LogicalType::~LogicalType((LogicalType *)&local_70);
  db_name._M_dataplus._M_p = (pointer)&db_name.field_2;
  db_name._M_string_length = 0;
  db_name.field_2._M_local_buf[0] = '\0';
  this_00 = input->inputs;
  if ((this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
  }
  else {
    pvVar1 = vector<duckdb::Value,_true>::get<true>(this_00,0);
    if (pvVar1->is_null == true) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_70,"Database argument for pragma_metadata_info cannot be NULL",
                 (allocator *)&local_78);
      BinderException::BinderException(this_01,&local_70);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
    StringValue::Get_abi_cxx11_(pvVar1);
  }
  ::std::__cxx11::string::_M_assign((string *)&db_name);
  pCVar2 = Catalog::GetCatalog(context,&db_name);
  make_uniq<duckdb::PragmaMetadataFunctionData>();
  (*pCVar2->_vptr_Catalog[0x14])(&local_70,pCVar2,context);
  pPVar3 = unique_ptr<duckdb::PragmaMetadataFunctionData,_std::default_delete<duckdb::PragmaMetadataFunctionData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaMetadataFunctionData,_std::default_delete<duckdb::PragmaMetadataFunctionData>,_true>
                         *)&local_78);
  ::std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>::
  _M_move_assign(&(pPVar3->metadata_info).
                  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
                 ,&local_70);
  ::std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>::~vector
            ((vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_> *)
             &local_70);
  *(tuple<duckdb::PragmaMetadataFunctionData_*,_std::default_delete<duckdb::PragmaMetadataFunctionData>_>
    *)this = local_78._M_t.
             super__Tuple_impl<0UL,_duckdb::PragmaMetadataFunctionData_*,_std::default_delete<duckdb::PragmaMetadataFunctionData>_>
             .super__Head_base<0UL,_duckdb::PragmaMetadataFunctionData_*,_false>._M_head_impl;
  ::std::__cxx11::string::~string((string *)&db_name);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> PragmaMetadataInfoBind(ClientContext &context, TableFunctionBindInput &input,
                                                       vector<LogicalType> &return_types, vector<string> &names) {
	names.emplace_back("block_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("total_blocks");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("free_blocks");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("free_list");
	return_types.emplace_back(LogicalType::LIST(LogicalType::BIGINT));

	string db_name;
	if (input.inputs.empty()) {
		db_name = DatabaseManager::GetDefaultDatabase(context);
	} else {
		if (input.inputs[0].IsNull()) {
			throw BinderException("Database argument for pragma_metadata_info cannot be NULL");
		}
		db_name = StringValue::Get(input.inputs[0]);
	}
	auto &catalog = Catalog::GetCatalog(context, db_name);
	auto result = make_uniq<PragmaMetadataFunctionData>();
	result->metadata_info = catalog.GetMetadataInfo(context);
	return std::move(result);
}